

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::JunitReporter::writeSection
          (JunitReporter *this,string *className,string *rootName,SectionNode *sectionNode,
          bool testOkToFail)

{
  XmlWriter *this_00;
  pointer puVar1;
  StringRef text;
  StringRef text_00;
  bool bVar2;
  unique_ptr<Catch::CumulativeReporterBase::SectionNode> *childNode;
  pointer puVar3;
  StringRef name_00;
  StringRef name_01;
  StringRef name_02;
  StringRef name_03;
  StringRef name_04;
  StringRef name_05;
  StringRef name_06;
  StringRef attribute;
  StringRef attribute_00;
  StringRef attribute_01;
  StringRef attribute_02;
  allocator<char> local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  JunitReporter *local_98;
  undefined1 local_90 [32];
  ScopedElement local_70;
  string name;
  ScopedElement e;
  _anonymous_namespace_ *this_01;
  
  local_98 = this;
  trim(&name,(string *)sectionNode);
  if (rootName->_M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                   rootName,'/');
    std::operator+(&local_b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                   &name);
    std::__cxx11::string::operator=((string *)&name,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)local_90);
  }
  bVar2 = CumulativeReporterBase::SectionNode::hasAnyAssertions(sectionNode);
  if (((bVar2) || ((sectionNode->stdOut)._M_string_length != 0)) ||
     ((sectionNode->stdErr)._M_string_length != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"testcase",(allocator<char> *)local_90);
    this_00 = &local_98->xml;
    XmlWriter::scopedElement((XmlWriter *)&e,(string *)this_00,(XmlFormatting)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    if (className->_M_string_length == 0) {
      name_02.m_size = 9;
      name_02.m_start = "classname";
      XmlWriter::writeAttribute(this_00,name_02,(StringRef)name._0_16_);
      name_03.m_size = 4;
      name_03.m_start = "name";
      this_01 = (_anonymous_namespace_ *)0x16bbfc;
      attribute_00.m_size = 4;
      attribute_00.m_start = "root";
      XmlWriter::writeAttribute(this_00,name_03,attribute_00);
    }
    else {
      name_00.m_size = 9;
      name_00.m_start = "classname";
      attribute.m_size = className->_M_string_length;
      attribute.m_start = (className->_M_dataplus)._M_p;
      XmlWriter::writeAttribute(this_00,name_00,attribute);
      name_01.m_size = 4;
      name_01.m_start = "name";
      this_01 = (_anonymous_namespace_ *)0x16bbfc;
      XmlWriter::writeAttribute(this_00,name_01,(StringRef)name._0_16_);
    }
    (anonymous_namespace)::formatDuration_abi_cxx11_
              (&local_b8,this_01,(sectionNode->stats).durationInSeconds);
    name_04.m_size = 4;
    name_04.m_start = "time";
    XmlWriter::writeAttribute(this_00,name_04,(StringRef)local_b8._0_16_);
    std::__cxx11::string::~string((string *)&local_b8);
    name_05.m_size = 6;
    name_05.m_start = "status";
    attribute_01.m_size = 3;
    attribute_01.m_start = "run";
    XmlWriter::writeAttribute(this_00,name_05,attribute_01);
    if ((sectionNode->stats).assertions.failedButOk != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"skipped",(allocator<char> *)(local_90 + 0x20));
      XmlWriter::scopedElement((XmlWriter *)local_90,(string *)this_00,(XmlFormatting)&local_b8);
      name_06.m_size = 7;
      name_06.m_start = "message";
      attribute_02.m_size = 0x1e;
      attribute_02.m_start = "TEST_CASE tagged with !mayfail";
      XmlWriter::writeAttribute((XmlWriter *)local_90._0_8_,name_06,attribute_02);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_90);
      std::__cxx11::string::~string((string *)&local_b8);
    }
    writeAssertions(local_98,sectionNode);
    if ((sectionNode->stdOut)._M_string_length != 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"system-out",&local_b9)
      ;
      XmlWriter::scopedElement
                ((XmlWriter *)(local_90 + 0x20),(string *)this_00,(XmlFormatting)&local_b8);
      trim((string *)local_90,&sectionNode->stdOut);
      text.m_size = local_90._8_8_;
      text.m_start = (char *)local_90._0_8_;
      XmlWriter::writeText(local_70.m_writer,text,Newline);
      std::__cxx11::string::~string((string *)local_90);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)(local_90 + 0x20));
      std::__cxx11::string::~string((string *)&local_b8);
    }
    if ((sectionNode->stdErr)._M_string_length != 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"system-err",&local_b9)
      ;
      XmlWriter::scopedElement
                ((XmlWriter *)(local_90 + 0x20),(string *)this_00,(XmlFormatting)&local_b8);
      trim((string *)local_90,&sectionNode->stdErr);
      text_00.m_size = local_90._8_8_;
      text_00.m_start = (char *)local_90._0_8_;
      XmlWriter::writeText(local_70.m_writer,text_00,Newline);
      std::__cxx11::string::~string((string *)local_90);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)(local_90 + 0x20));
      std::__cxx11::string::~string((string *)&local_b8);
    }
    XmlWriter::ScopedElement::~ScopedElement(&e);
  }
  puVar1 = (sectionNode->childSections).
           super__Vector_base<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar3 = (sectionNode->childSections).
                super__Vector_base<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    if (className->_M_string_length == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"",(allocator<char> *)local_90);
      writeSection(local_98,&name,&local_b8,puVar3->m_ptr,testOkToFail);
      std::__cxx11::string::~string((string *)&local_b8);
    }
    else {
      writeSection(local_98,className,&name,puVar3->m_ptr,testOkToFail);
    }
  }
  std::__cxx11::string::~string((string *)&name);
  return;
}

Assistant:

void JunitReporter::writeSection( std::string const& className,
                                      std::string const& rootName,
                                      SectionNode const& sectionNode,
                                      bool testOkToFail) {
        std::string name = trim( sectionNode.stats.sectionInfo.name );
        if( !rootName.empty() )
            name = rootName + '/' + name;

        if( sectionNode.hasAnyAssertions()
           || !sectionNode.stdOut.empty()
           || !sectionNode.stdErr.empty() ) {
            XmlWriter::ScopedElement e = xml.scopedElement( "testcase" );
            if( className.empty() ) {
                xml.writeAttribute( "classname"_sr, name );
                xml.writeAttribute( "name"_sr, "root"_sr );
            }
            else {
                xml.writeAttribute( "classname"_sr, className );
                xml.writeAttribute( "name"_sr, name );
            }
            xml.writeAttribute( "time"_sr, formatDuration( sectionNode.stats.durationInSeconds ) );
            // This is not ideal, but it should be enough to mimic gtest's
            // junit output.
            // Ideally the JUnit reporter would also handle `skipTest`
            // events and write those out appropriately.
            xml.writeAttribute( "status"_sr, "run"_sr );

            if (sectionNode.stats.assertions.failedButOk) {
                xml.scopedElement("skipped")
                    .writeAttribute("message", "TEST_CASE tagged with !mayfail");
            }

            writeAssertions( sectionNode );


            if( !sectionNode.stdOut.empty() )
                xml.scopedElement( "system-out" ).writeText( trim( sectionNode.stdOut ), XmlFormatting::Newline );
            if( !sectionNode.stdErr.empty() )
                xml.scopedElement( "system-err" ).writeText( trim( sectionNode.stdErr ), XmlFormatting::Newline );
        }
        for( auto const& childNode : sectionNode.childSections )
            if( className.empty() )
                writeSection( name, "", *childNode, testOkToFail );
            else
                writeSection( className, name, *childNode, testOkToFail );
    }